

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_client_connection.c
# Opt level: O0

apx_error_t
apx_clientSocketConnection_transmit_data_message
          (apx_clientSocketConnection_t *self,uint32_t write_address,_Bool more_bit,
          uint8_t *msg_data,int32_t msg_size,int32_t *bytes_available)

{
  apx_size_t aVar1;
  uint value;
  uint uVar2;
  apx_size_t aVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  apx_size_t buffer_available;
  apx_size_t bytes_to_send;
  apx_size_t header2_size;
  apx_size_t header1_size;
  apx_size_t payload_size;
  apx_size_t address_size;
  uint8_t header [8];
  int32_t *bytes_available_local;
  int32_t msg_size_local;
  uint8_t *msg_data_local;
  _Bool more_bit_local;
  uint32_t write_address_local;
  apx_clientSocketConnection_t *self_local;
  
  if (self == (apx_clientSocketConnection_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    header = (uint8_t  [8])bytes_available;
    aVar1 = rmf_needed_encoding_size(write_address);
    value = aVar1 + msg_size;
    if (self->default_buffer_size < value) {
      self_local._4_4_ = 0x21;
    }
    else {
      uVar2 = numheader_encode32((uint8_t *)&payload_size,8,value);
      if (uVar2 == 0) {
        __assert_fail("header1_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/socket_client_connection.c"
                      ,0x1bf,
                      "apx_error_t apx_clientSocketConnection_transmit_data_message(apx_clientSocketConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      aVar3 = rmf_address_encode((uint8_t *)((long)&payload_size + (ulong)uVar2),8 - uVar2,
                                 write_address,more_bit);
      if (aVar3 != aVar1) {
        __assert_fail("header2_size == address_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/socket_client_connection.c"
                      ,0x1c1,
                      "apx_error_t apx_clientSocketConnection_transmit_data_message(apx_clientSocketConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      uVar4 = adt_bytearray_length(&self->send_buffer);
      if ((uVar4 - self->pending_bytes < uVar2 + aVar3 + value) &&
         (send_packet(self), self->pending_bytes != 0)) {
        __assert_fail("self->pending_bytes == 0u",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/socket_client_connection.c"
                      ,0x1c7,
                      "apx_error_t apx_clientSocketConnection_transmit_data_message(apx_clientSocketConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      puVar5 = adt_bytearray_data(&self->send_buffer);
      memcpy(puVar5 + self->pending_bytes,&payload_size,(ulong)(uVar2 + aVar3));
      self->pending_bytes = uVar2 + aVar3 + self->pending_bytes;
      puVar5 = adt_bytearray_data(&self->send_buffer);
      memcpy(puVar5 + self->pending_bytes,msg_data,(long)msg_size);
      self->pending_bytes = msg_size + self->pending_bytes;
      uVar4 = adt_bytearray_length(&self->send_buffer);
      *(uint32_t *)header = uVar4 - self->pending_bytes;
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t apx_clientSocketConnection_transmit_data_message(apx_clientSocketConnection_t* self, uint32_t write_address, bool more_bit, uint8_t const* msg_data, int32_t msg_size, int32_t* bytes_available)
{
   if (self != NULL)
   {
      uint8_t header[NUMHEADER32_LONG_SIZE + RMF_HIGH_ADDR_SIZE];
      apx_size_t const address_size = rmf_needed_encoding_size(write_address);
      apx_size_t const payload_size = address_size + msg_size;
      if (payload_size > self->default_buffer_size)
      {
         return APX_MSG_TOO_LARGE_ERROR;
      }
      apx_size_t const header1_size = numheader_encode32(header, sizeof(header), payload_size);
      assert(header1_size > 0);
      apx_size_t const header2_size = rmf_address_encode(header + header1_size, sizeof(header) - header1_size, write_address, more_bit);
      assert(header2_size == address_size);
      apx_size_t const bytes_to_send = header1_size + header2_size + payload_size;
      apx_size_t const buffer_available = ((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes;
      if (bytes_to_send > buffer_available)
      {
         send_packet(self);
         assert(self->pending_bytes == 0u);
      }
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, header, header1_size + header2_size);
      self->pending_bytes += (header1_size + header2_size);
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, msg_data, msg_size);
      self->pending_bytes += msg_size;
      *bytes_available = (int32_t)(((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}